

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

void __thiscall anurbs::RTree<3L>::finish(RTree<3L> *this,bool hilbert_sort)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Scalar SVar4;
  size_type __n;
  long lVar5;
  runtime_error *prVar6;
  reference pvVar7;
  Index IVar8;
  Scalar *pSVar9;
  CoeffReturnType pdVar10;
  size_t sVar11;
  ulong uVar12;
  Scalar *pSVar13;
  reference pvVar14;
  reference pvVar15;
  Index IVar16;
  double dVar17;
  undefined1 auVar18 [16];
  long local_180;
  Index k;
  Vector box_max_1;
  Vector box_min_1;
  Index j_2;
  Index node_index;
  Index j_1;
  Vector node_max;
  Vector node_min;
  Index end;
  Index i_1;
  Index pos;
  long local_d0;
  Index j;
  VectorU center;
  Vector box_max;
  Vector box_min;
  Index i;
  undefined1 local_70 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hilbert_values;
  Matrix<double,1,3,1,1,3> local_40 [8];
  Vector size;
  bool hilbert_sort_local;
  RTree<3L> *this_local;
  
  if (this->m_nb_items < this->m_position) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"More items then expected");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->m_position < this->m_nb_items) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Less items then expected");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)&hilbert_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
             (MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)&this->m_max,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&this->m_min);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            (local_40,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                       *)&hilbert_values.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  if (hilbert_sort) {
    __n = this->m_nb_items;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,__n,
               (allocator<unsigned_long> *)((long)&i + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i + 7));
    for (box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
         [2] = 0.0;
        (long)box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array[2] < this->m_nb_items;
        box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [2] = (double)((long)box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                             m_storage.m_data.array[2] + 1)) {
      pvVar7 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[](&this->m_boxes_min,
                            (size_type)
                            box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                            m_storage.m_data.array[2]);
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
                ((Matrix<double,_1,_3,_1,_1,_3> *)
                 (box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array + 2),pvVar7);
      pvVar7 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[](&this->m_boxes_max,
                            (size_type)
                            box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                            m_storage.m_data.array[2]);
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
                ((Matrix<double,_1,_3,_1,_1,_3> *)
                 (center.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.
                  m_storage.m_data.array + 2),pvVar7);
      Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>::Matrix
                ((Matrix<unsigned_long,_1,_3,_1,_1,_3> *)&j);
      for (local_d0 = 0; lVar5 = local_d0, IVar8 = dimension(), lVar5 < IVar8;
          local_d0 = local_d0 + 1) {
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                            (box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                             m_storage.m_data.array + 2),local_d0);
        dVar17 = *pSVar9;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                            (center.
                             super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.
                             m_storage.m_data.array + 2),local_d0);
        dVar1 = *pSVar9;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&this->m_min
                            ,local_d0);
        dVar2 = *pSVar9;
        pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)local_40,
                             local_d0);
        dVar3 = *pdVar10;
        sVar11 = HilbertCurve<3L>::max_axis_size();
        auVar18._8_4_ = (int)(sVar11 >> 0x20);
        auVar18._0_8_ = sVar11;
        auVar18._12_4_ = 0x45300000;
        dVar17 = (((dVar17 + dVar1) * 0.5 - dVar2) / dVar3) *
                 ((auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0));
        uVar12 = (ulong)dVar17;
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_1> *)&j,
                             local_d0);
        *pSVar13 = uVar12 | (long)(dVar17 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f;
      }
      Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>::Matrix
                ((Matrix<unsigned_long,_1,_3,_1,_1,_3> *)&pos,
                 (Matrix<unsigned_long,_1,_3,_1,_1,_3> *)&j);
      sVar11 = HilbertCurve<3L>::index_at((VectorU *)&pos);
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,
                           (size_type)
                           box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                           m_storage.m_data.array[2]);
      *pvVar14 = sVar11;
    }
    sort(this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,0,
         this->m_nb_items + -1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70);
  }
  i_1 = 0;
  for (end = 0; IVar8 = length<std::vector<long,std::allocator<long>>>(&this->m_level_bounds),
      end < IVar8 + -1; end = end + 1) {
    pvVar15 = std::vector<long,_std::allocator<long>_>::operator[](&this->m_level_bounds,end);
    lVar5 = *pvVar15;
    while (IVar8 = i_1, i_1 < lVar5) {
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
                ((Matrix<double,_1,_3,_1,_1,_3> *)
                 (node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array + 2));
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)&j_1);
      for (node_index = 0; node_index < 3; node_index = node_index + 1) {
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                            (node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                             m_storage.m_data.array + 2),node_index);
        *pSVar9 = INFINITY;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&j_1,
                            node_index);
        *pSVar9 = -INFINITY;
      }
      for (box_min_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
           array[2] = 0.0;
          (long)box_min_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[2] < this->m_node_size && i_1 < lVar5;
          box_min_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[2] = (double)((long)box_min_1.
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                    m_storage.m_data.array[2] + 1)) {
        pvVar7 = std::
                 vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                 ::operator[](&this->m_boxes_min,i_1);
        Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
                  ((Matrix<double,_1,_3,_1,_1,_3> *)
                   (box_max_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                    .m_data.array + 2),pvVar7);
        pvVar7 = std::
                 vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                 ::operator[](&this->m_boxes_max,i_1);
        Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)&k,pvVar7);
        i_1 = i_1 + 1;
        for (local_180 = 0; IVar16 = dimension(), local_180 < IVar16; local_180 = local_180 + 1) {
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                              (box_max_1.
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                               m_storage.m_data.array + 2),local_180);
          dVar17 = *pSVar9;
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                              (node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                               .m_storage.m_data.array + 2),local_180);
          if (dVar17 < *pSVar9) {
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                (box_max_1.
                                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                 m_storage.m_data.array + 2),local_180);
            SVar4 = *pSVar9;
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                (node_max.
                                 super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                 m_storage.m_data.array + 2),local_180);
            *pSVar9 = SVar4;
          }
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&k,
                              local_180);
          dVar17 = *pSVar9;
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&j_1,
                              local_180);
          if (*pSVar9 <= dVar17 && dVar17 != *pSVar9) {
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&k,
                                local_180);
            SVar4 = *pSVar9;
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&j_1,
                                local_180);
            *pSVar9 = SVar4;
          }
        }
      }
      pvVar15 = std::vector<long,_std::allocator<long>_>::operator[]
                          (&this->m_indices,this->m_position);
      *pvVar15 = IVar8;
      pvVar7 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[](&this->m_boxes_min,this->m_position);
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=
                (pvVar7,(Matrix<double,_1,_3,_1,_1,_3> *)
                        (node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                         m_storage.m_data.array + 2));
      pvVar7 = std::
               vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               ::operator[](&this->m_boxes_max,this->m_position);
      Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=(pvVar7,(Matrix<double,_1,_3,_1,_1,_3> *)&j_1);
      this->m_position = this->m_position + 1;
    }
  }
  return;
}

Assistant:

void finish(const bool hilbert_sort)
    {
        if (m_position > m_nb_items) {
            throw std::runtime_error("More items then expected");
        }
        if (m_position < m_nb_items) {
            throw std::runtime_error("Less items then expected");
        }

        const Vector size = m_max - m_min;

        if (hilbert_sort) {
        std::vector<size_t> hilbert_values(m_nb_items);

        for (Index i = 0; i < m_nb_items; i++) {
            Vector box_min = m_boxes_min[i];
            Vector box_max = m_boxes_max[i];

            VectorU center;

            for (Index j = 0; j < dimension(); j++) {
                center[j] = ((box_min[j] + box_max[j]) / 2 - m_min[j]) / size[j] * HilbertCurve<TDimension>::max_axis_size();
            }

            hilbert_values[i] = HilbertCurve<TDimension>::index_at(center);
        }

        sort(hilbert_values, 0, m_nb_items - 1);
        }

        Index pos = 0;

        for (Index i = 0; i < length(m_level_bounds) - 1; i++) {
            Index end = m_level_bounds[i];

            while (pos < end) {
                Vector node_min;
                Vector node_max;

                for (Index j = 0; j < TDimension; j++) {
                    node_min[j] = Infinity;
                    node_max[j] = -Infinity;
                }

                Index node_index = pos;

                for (Index j = 0; j < m_node_size && pos < end; j++) {
                    Vector box_min = m_boxes_min[pos];
                    Vector box_max = m_boxes_max[pos];

                    pos += 1;

                    for (Index k = 0; k < dimension(); k++) {
                        if (box_min[k] < node_min[k]) {
                            node_min[k] = box_min[k];
                        }
                        if (box_max[k] > node_max[k]) {
                            node_max[k] = box_max[k];
                        }
                    }
                }

                m_indices[m_position] = node_index;
                m_boxes_min[m_position] = node_min;
                m_boxes_max[m_position] = node_max;

                m_position += 1;
            }
        }
    }